

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::MenuItem(char *label,char *shortcut,bool selected,bool enabled)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImU32 col;
  uint flags;
  float fVar5;
  float fVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float local_98;
  ImVec2 local_80;
  undefined1 local_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ulong local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    _local_78 = ZEXT416((uint)(pIVar1->DC).CursorPos.x);
    local_58 = ZEXT416((uint)(pIVar1->DC).CursorPos.y);
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_60 = (ulong)!enabled;
    flags = (uint)!enabled * 8 + 0x2400000;
    local_98 = IVar2.x;
    if ((pIVar1->DC).LayoutType == 0) {
      local_80.x = (pIVar3->Style).ItemSpacing.x;
      (pIVar1->DC).CursorPos.x = (float)(int)(local_80.x * 0.5) + (pIVar1->DC).CursorPos.x;
      local_80.x = local_80.x + local_80.x;
      local_80.y = (pIVar3->Style).ItemSpacing.y;
      PushStyleVar(0xd,&local_80);
      local_80.x = local_98;
      local_80.y = 0.0;
      bVar4 = Selectable(label,false,flags,&local_80);
      PopStyleVar(1);
      (pIVar1->DC).CursorPos.x =
           (float)(int)((pIVar3->Style).ItemSpacing.x * -0.5) + (pIVar1->DC).CursorPos.x;
    }
    else {
      if (shortcut == (char *)0x0) {
        local_48 = 0.0;
        fStack_44 = 0.0;
        uStack_40 = 0;
        uStack_3c = 0;
      }
      else {
        IVar2 = CalcTextSize(shortcut,(char *)0x0,false,-1.0);
        local_48 = IVar2.x;
        fStack_44 = IVar2.y;
        uStack_40 = extraout_XMM0_Dc;
        uStack_3c = extraout_XMM0_Dd;
      }
      fVar5 = ImGuiMenuColumns::DeclColumns
                        (&(pIVar1->DC).MenuColumns,local_98,local_48,
                         (float)(int)(pIVar3->FontSize * 1.2));
      IVar2 = GetContentRegionAvail();
      fVar6 = IVar2.x - fVar5;
      fVar6 = (float)(~-(uint)(fVar6 <= 0.0) & (uint)fVar6);
      local_80.y = 0.0;
      local_80.x = fVar5;
      bVar4 = Selectable(label,false,flags | 0x800000,&local_80);
      if (0.0 < local_48) {
        PushStyleColor(0,(pIVar3->Style).Colors + 1);
        IVar2.y = (float)local_58._0_4_ + 0.0;
        IVar2.x = (pIVar1->DC).MenuColumns.Pos[1] + fVar6 + (float)local_78._0_4_;
        RenderText(IVar2,shortcut,(char *)0x0,false);
        PopStyleColor(1);
      }
      if (selected) {
        uStack_70 = local_78._4_4_;
        local_78._4_4_ = (float)local_58._0_4_ + pIVar3->FontSize * 0.134 * 0.5;
        local_78._0_4_ =
             (float)local_78._0_4_ +
             pIVar3->FontSize * 0.4 + fVar6 + (pIVar1->DC).MenuColumns.Pos[2];
        uStack_6c = local_58._4_4_;
        col = GetColorU32((ImGuiCol)local_60,1.0);
        RenderCheckMark((ImVec2)local_78,col,pIVar3->FontSize * 0.866);
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}